

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrMode5Operand(MCInst *MI,uint OpNum,SStream *O,_Bool AlwaysPrintImm0)

{
  uint8_t *puVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  _Bool _Var3;
  byte bVar4;
  ARM_AM_AddrOpc Op;
  uint uVar5;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar6;
  char *pcVar7;
  ARM_AM_AddrOpc subtracted;
  MCOperand *MO2;
  MCOperand *MO1;
  uint ImmOffs;
  _Bool AlwaysPrintImm0_local;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  iVar6 = MCOperand_getImm(op_00);
  Op = ARM_AM_getAM5Op((uint)iVar6);
  _Var3 = MCOperand_isReg(op);
  if (_Var3) {
    SStream_concat0(O,"[");
    h = MI->csh;
    uVar5 = MCOperand_getReg(op);
    printRegName(h,O,uVar5);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x03';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar5 = MCOperand_getReg(op);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar5;
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x4a;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x4e;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x52;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
    }
    iVar6 = MCOperand_getImm(op_00);
    bVar4 = ARM_AM_getAM5Offset((uint)iVar6);
    uVar5 = (uint)bVar4;
    if (((AlwaysPrintImm0) || (uVar5 != 0)) || (Op == ARM_AM_sub)) {
      if (uVar5 << 2 < 10) {
        pcVar7 = ARM_AM_getAddrOpcStr(Op);
        SStream_concat(O,", #%s%u",pcVar7);
      }
      else {
        pcVar7 = ARM_AM_getAddrOpcStr(Op);
        SStream_concat(O,", #%s0x%x",pcVar7);
      }
      if (MI->csh->detail != CS_OPT_OFF) {
        if (Op == ARM_AM_sub) {
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x52) = uVar5 * -4;
        }
        else {
          *(uint *)(MI->flat_insn->detail->groups +
                   (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x52) = uVar5 << 2;
        }
      }
    }
    SStream_concat0(O,"]");
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
  }
  else {
    printOperand(MI,OpNum,O);
  }
  return;
}

Assistant:

static void printAddrMode5Operand(MCInst *MI, unsigned OpNum, SStream *O,
		bool AlwaysPrintImm0)
{
	unsigned ImmOffs;
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	ARM_AM_AddrOpc subtracted = ARM_AM_getAM5Op((unsigned int)MCOperand_getImm(MO2));

	if (!MCOperand_isReg(MO1)) {   // FIXME: This is for CP entries, but isn't right.
		printOperand(MI, OpNum, O);
		return;
	}

	SStream_concat0(O, "[");
	printRegName(MI->csh, O, MCOperand_getReg(MO1));

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_MEM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.index = ARM_REG_INVALID;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.scale = 1;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = 0;
	}

	ImmOffs = ARM_AM_getAM5Offset((unsigned int)MCOperand_getImm(MO2));
	if (AlwaysPrintImm0 || ImmOffs || subtracted == ARM_AM_sub) {
		if (ImmOffs * 4 > HEX_THRESHOLD)
			SStream_concat(O, ", #%s0x%x",
					ARM_AM_getAddrOpcStr(subtracted),
					ImmOffs * 4);
		else
			SStream_concat(O, ", #%s%u",
					ARM_AM_getAddrOpcStr(subtracted),
					ImmOffs * 4);
		if (MI->csh->detail) {
			if (subtracted)
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = ImmOffs * 4;
			else
				MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = -(int)ImmOffs * 4;
		}
	}
	SStream_concat0(O, "]");

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.op_count++;
	}
}